

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O0

void __thiscall DIntermissionScreenFader::Drawer(DIntermissionScreenFader *this)

{
  double x;
  DFrameBuffer *pDVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  FTexture *pFVar5;
  FIIntermissionPatch *pFVar6;
  uint local_24;
  uint i;
  double dStack_18;
  int color;
  double factor;
  DIntermissionScreenFader *this_local;
  
  if ((((this->super_DIntermissionScreen).mFlatfill & 1U) == 0) &&
     (bVar2 = FTextureID::isValid(&(this->super_DIntermissionScreen).mBackground), bVar2)) {
    dStack_18 = clamp<double>((double)(this->super_DIntermissionScreen).mTicker /
                              (double)*(int *)&(this->super_DIntermissionScreen).super_DObject.
                                               field_0x24,0.0,1.0);
    if (this->mType == FADE_In) {
      dStack_18 = 1.0 - dStack_18;
    }
    uVar3 = (int)(dStack_18 * 255.0) << 0x18;
    uVar4 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x25])
                      (screen,0);
    pDVar1 = screen;
    if ((uVar4 & 1) == 0) {
      V_SetBlend(0,0,0,(int)(dStack_18 * 256.0));
      DIntermissionScreen::Drawer(&this->super_DIntermissionScreen);
    }
    else {
      pFVar5 = FTextureManager::operator[]
                         (&TexMan,(FTextureID)(this->super_DIntermissionScreen).mBackground.texnum);
      DCanvas::DrawTexture((DCanvas *)pDVar1,pFVar5,0.0,0.0,0x400013ae,1,0x400013aa,(ulong)uVar3,0);
      for (local_24 = 0;
          uVar4 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::Size
                            (&(this->super_DIntermissionScreen).mOverlays), local_24 < uVar4;
          local_24 = local_24 + 1) {
        bVar2 = DIntermissionScreen::CheckOverlay(&this->super_DIntermissionScreen,local_24);
        pDVar1 = screen;
        if (bVar2) {
          pFVar6 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                             (&(this->super_DIntermissionScreen).mOverlays,(ulong)local_24);
          pFVar5 = FTextureManager::operator[](&TexMan,(FTextureID)(pFVar6->mPic).texnum);
          pFVar6 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                             (&(this->super_DIntermissionScreen).mOverlays,(ulong)local_24);
          x = pFVar6->x;
          pFVar6 = TArray<FIIntermissionPatch,_FIIntermissionPatch>::operator[]
                             (&(this->super_DIntermissionScreen).mOverlays,(ulong)local_24);
          DCanvas::DrawTexture
                    ((DCanvas *)pDVar1,pFVar5,x,pFVar6->y,0x40001391,1,0x400013aa,(ulong)uVar3,0);
        }
      }
      DCanvas::FillBorder((DCanvas *)screen,(FTexture *)0x0);
    }
  }
  return;
}

Assistant:

void DIntermissionScreenFader::Drawer ()
{
	if (!mFlatfill && mBackground.isValid())
	{
		double factor = clamp(double(mTicker) / mDuration, 0., 1.);
		if (mType == FADE_In) factor = 1.0 - factor;
		int color = MAKEARGB(int(factor*255), 0,0,0);

		if (screen->Begin2D(false))
		{
			screen->DrawTexture (TexMan[mBackground], 0, 0, DTA_Fullscreen, true, DTA_ColorOverlay, color, TAG_DONE);
			for (unsigned i=0; i < mOverlays.Size(); i++)
			{
				if (CheckOverlay(i))
					screen->DrawTexture (TexMan[mOverlays[i].mPic], mOverlays[i].x, mOverlays[i].y, DTA_320x200, true, DTA_ColorOverlay, color, TAG_DONE);
			}
			screen->FillBorder (NULL);
		}
		else
		{
			V_SetBlend (0,0,0,int(256*factor));
			Super::Drawer();
		}
	}
}